

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsBody.cpp
# Opt level: O3

void __thiscall
chrono::ChShaftsBodyTranslation::ChShaftsBodyTranslation(ChShaftsBodyTranslation *this)

{
  double dVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [64];
  undefined1 auVar4 [32];
  
  ChObj::ChObj((ChObj *)this);
  auVar2 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])
   ((long)&(this->super_ChPhysicsItem).cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = auVar2;
  (this->super_ChPhysicsItem).system = (ChSystem *)auVar2._0_8_;
  (this->super_ChPhysicsItem).vis_model_instance =
       (shared_ptr<chrono::ChVisualModelInstance>)auVar2._8_16_;
  (this->super_ChPhysicsItem).cameras.
  super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar2._24_8_;
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChShaftsBodyTranslation_00b24128;
  this->force_react = 0.0;
  auVar2 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.c_i = (double)auVar2._0_8_;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.l_i = (double)auVar2._8_8_;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.b_i = (double)auVar2._16_8_;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.cfm_i = (double)auVar2._24_8_;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.valid = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.disabled = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.redundant = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.broken = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.active = true;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.g_i = 0.0;
  (this->constraint).super_ChConstraintTwo.variables_a = (ChVariables *)SUB168(ZEXT416(0) << 0x40,0)
  ;
  (this->constraint).super_ChConstraintTwo.variables_b = (ChVariables *)SUB168(ZEXT416(0) << 0x40,8)
  ;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoGeneric_00b3ae50;
  auVar3 = ZEXT464(0) << 0x40;
  (this->constraint).Cq_a = (ChRowVectorDynamic<double>)auVar3._0_16_;
  (this->constraint).Cq_b = (ChRowVectorDynamic<double>)auVar3._16_16_;
  (this->constraint).Eq_a = (ChVectorDynamic<double>)auVar3._32_16_;
  (this->constraint).Eq_b = (ChVectorDynamic<double>)auVar3._48_16_;
  *(undefined1 (*) [64])&(this->constraint).Cq_b = auVar3;
  auVar2._8_8_ = DAT_00b689f0;
  auVar2._0_8_ = DAT_00b689f0;
  auVar2._16_8_ = DAT_00b689f0;
  auVar2._24_8_ = DAT_00b689f0;
  auVar4._8_8_ = VNULL;
  auVar4._0_8_ = VNULL;
  auVar4._16_8_ = VNULL;
  auVar4._24_8_ = VNULL;
  auVar2 = vblendps_avx(ZEXT1632(_VECT_Z),auVar2,0x30);
  auVar2 = vblendps_avx(auVar2,auVar4,0xc0);
  this->shaft_dir = (ChVector<double>)auVar2._0_24_;
  dVar1 = DAT_00b689a8;
  (this->shaft_pos).m_data[0] = (double)auVar2._24_8_;
  (this->shaft_pos).m_data[1] = DAT_00b689a0;
  (this->shaft_pos).m_data[2] = dVar1;
  return;
}

Assistant:

ChShaftsBodyTranslation::ChShaftsBodyTranslation() : force_react(0), shaft(NULL), body(NULL), shaft_dir(VECT_Z), shaft_pos(VNULL) {}